

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QFutureCallOutInterface_*>::reallocateAndGrow
          (QArrayDataPointer<QFutureCallOutInterface_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QFutureCallOutInterface_*> *old)

{
  long lVar1;
  bool bVar2;
  QFutureCallOutInterface **ppQVar3;
  QPodArrayOps<QFutureCallOutInterface_*> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QFutureCallOutInterface_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QFutureCallOutInterface_*> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<QFutureCallOutInterface_*> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QFutureCallOutInterface_*> *in_stack_ffffffffffffff78;
  QArrayDataPointer<QFutureCallOutInterface_*> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QFutureCallOutInterface_*> *)&DAT_aaaaaaaaaaaaaaaa,
                 (qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (ppQVar3 = data((QArrayDataPointer<QFutureCallOutInterface_*> *)&stack0xffffffffffffffe0),
       ppQVar3 == (QFutureCallOutInterface **)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_006e45c4;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QFutureCallOutInterface_*> *)
                  operator->((QArrayDataPointer<QFutureCallOutInterface_*> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QFutureCallOutInterface_*> *)0x6e44d7);
        begin((QArrayDataPointer<QFutureCallOutInterface_*> *)0x6e44e6);
        QtPrivate::QPodArrayOps<QFutureCallOutInterface_*>::copyAppend
                  (this_00,(QFutureCallOutInterface **)in_stack_ffffffffffffff78,
                   (QFutureCallOutInterface **)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QFutureCallOutInterface_*> *)
             operator->((QArrayDataPointer<QFutureCallOutInterface_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QFutureCallOutInterface_*> *)0x6e451f);
        begin((QArrayDataPointer<QFutureCallOutInterface_*> *)0x6e452e);
        QtPrivate::QPodArrayOps<QFutureCallOutInterface_*>::moveAppend
                  ((QPodArrayOps<QFutureCallOutInterface_*> *)in_stack_ffffffffffffff70,
                   (QFutureCallOutInterface **)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (QFutureCallOutInterface **)0x6e454c);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<QFutureCallOutInterface_*> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<QFutureCallOutInterface_*> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<QFutureCallOutInterface_*>::reallocate
              ((QPodArrayOps<QFutureCallOutInterface_*> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_006e45c4:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }